

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve.hpp
# Opt level: O2

double __thiscall
Curve<3,_2>::findClosestParameter
          (Curve<3,_2> *this,PointType *point,double init_param,int *max_iter)

{
  int iVar1;
  int iter;
  int iVar2;
  double dVar3;
  ResScalar RVar4;
  double dVar5;
  double init_param_local;
  undefined4 local_94;
  PointType *local_90;
  int *local_88;
  double local_80;
  PointType second_order;
  PointType first_order;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>
  d;
  
  iVar1 = *max_iter;
  local_90 = point;
  local_88 = max_iter;
  if (0 < iVar1) {
    for (iVar2 = 0; iVar2 < iVar1; iVar2 = iVar2 + 1) {
      second_order.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.
      array[0]._0_4_ = 0;
      init_param_local = init_param;
      (*this->_vptr_Curve[2])
                ((MatrixBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)&first_order,this,
                 &init_param_local,
                 (MatrixBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)&second_order);
      d.m_rhs = local_90;
      second_order.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.
      array[0]._0_4_ = 1;
      d.m_lhs = (LhsNested)&first_order;
      (*this->_vptr_Curve[2])
                ((MatrixBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)&first_order,this,
                 &init_param_local,
                 (MatrixBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)&second_order);
      local_94 = 2;
      (*this->_vptr_Curve[2])
                ((MatrixBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)&second_order,this,
                 &init_param_local,&local_94);
      local_80 = Eigen::internal::
                 dot_nocheck<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_false>
                 ::run((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                        *)&d,(MatrixBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)&first_order);
      dVar3 = first_order.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.
              m_data.array[0] *
              first_order.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.
              m_data.array[0];
      dVar5 = first_order.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.
              m_data.array[1] *
              first_order.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.
              m_data.array[1];
      RVar4 = Eigen::internal::
              dot_nocheck<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_false>
              ::run((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                     *)&d,(MatrixBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)&second_order);
      init_param = init_param_local - local_80 / (RVar4 + dVar5 + dVar3 + 2.2250738585072014e-308);
      iVar1 = *local_88;
    }
    return init_param;
  }
  init_param_local = init_param;
  __assert_fail("max_iter > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/tanzby[P]ParametricCurve/src/curve.hpp"
                ,0x43,
                "virtual double Curve<>::findClosestParameter(const PointType &, double, const int &) const [N = 3, PointDim = 2]"
               );
}

Assistant:

virtual auto findClosestParameter(const PointType& point,
                                    double init_param,
                                    const int& max_iter = 20) const -> double {
    /**
     * 找到参数u使得离点p是最近的，即求解
     * f = (C(u)-p)*C'(u) = 0
     * f'= C'(u)*C'(u) + (C(u)-p)*C''(u)
     * 当给定u_{n+1} = u_{n} - f/f'
     */
    assert(max_iter > 0);
    double numerator;
    double denominator;
    for (int iter = 0; iter < max_iter; ++iter) {
      auto d = this->at(init_param) - point;
      auto first_order = this->at(init_param, 1);
      auto second_order = this->at(init_param, 2);

      numerator = d.dot(first_order);
      denominator =
          first_order.dot(first_order) + d.dot(second_order) + std::numeric_limits<double>::min();
      init_param = init_param - numerator / denominator;
    }

    return init_param;
  }